

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::tryReadWithFds
          (BlockedPumpFrom *this,void *readBuffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds)

{
  PromiseArena *pPVar1;
  AsyncInputStream AVar2;
  PromiseArenaMember *in_RAX;
  void *pvVar3;
  TransformPromiseNodeBase *this_00;
  AsyncInputStream local_28;
  
  local_28._vptr_AsyncInputStream = (_func_int **)in_RAX;
  tryRead((BlockedPumpFrom *)&stack0xffffffffffffffd8,readBuffer,minBytes,maxBytes);
  AVar2._vptr_AsyncInputStream = local_28._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)local_28._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_28._vptr_AsyncInputStream - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&stack0xffffffffffffffd8,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:808:17)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00647a68;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_28._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_28._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&stack0xffffffffffffffd8,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:808:17)>
               ::anon_class_1_0_00000001_for_func::operator());
    AVar2._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_00647a68;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  AVar2._vptr_AsyncInputStream = local_28._vptr_AsyncInputStream;
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)this_00;
  if ((PromiseArenaMember *)local_28._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
    local_28._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<ReadResult> tryReadWithFds(void* readBuffer, size_t minBytes, size_t maxBytes,
                                       OwnFd* fdBuffer, size_t maxFds) override {
      // Pumps drop all capabilities, so fall back to regular read. (We don't even know if the
      // destination is an AsyncCapabilityStream...)
      return tryRead(readBuffer, minBytes, maxBytes)
          .then([](size_t n) { return ReadResult { n, 0 }; });
    }